

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int n;
  int local_20;
  int local_1c;
  int j;
  int i;
  int u_local;
  int l_local;
  lua_State *L_local;
  
  j = u;
  i = l;
  while( true ) {
    if (j <= i) {
      return;
    }
    lua_rawgeti(L,1,i);
    lua_rawgeti(L,1,j);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      set2(L,i,j);
    }
    if (j - i == 1) break;
    iVar1 = (i + j) / 2;
    lua_rawgeti(L,1,iVar1);
    lua_rawgeti(L,1,i);
    iVar2 = sort_comp(L,-2,-1);
    if (iVar2 == 0) {
      lua_settop(L,-2);
      lua_rawgeti(L,1,j);
      iVar2 = sort_comp(L,-1,-2);
      if (iVar2 == 0) {
        lua_settop(L,-3);
      }
      else {
        set2(L,iVar1,j);
      }
    }
    else {
      set2(L,iVar1,i);
    }
    if (j - i == 2) {
      return;
    }
    lua_rawgeti(L,1,iVar1);
    lua_pushvalue(L,-1);
    lua_rawgeti(L,1,j + -1);
    set2(L,iVar1,j + -1);
    local_1c = i;
    local_20 = j + -1;
    while( true ) {
      while( true ) {
        iVar1 = local_1c;
        n = local_1c + 1;
        lua_rawgeti(L,1,n);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 == 0) break;
        if (j <= n) {
          lj_err_caller(L,LJ_ERR_TABSORT);
        }
        lua_settop(L,-2);
        local_1c = n;
      }
      while( true ) {
        local_20 = local_20 + -1;
        lua_rawgeti(L,1,local_20);
        iVar2 = sort_comp(L,-3,-1);
        if (iVar2 == 0) break;
        if (local_20 <= i) {
          lj_err_caller(L,LJ_ERR_TABSORT);
        }
        lua_settop(L,-2);
      }
      if (local_20 < n) break;
      set2(L,n,local_20);
      local_1c = n;
    }
    lua_settop(L,-4);
    lua_rawgeti(L,1,j + -1);
    lua_rawgeti(L,1,n);
    set2(L,j + -1,n);
    if (n - i < j - n) {
      local_20 = i;
      i = local_1c + 2;
    }
    else {
      local_20 = local_1c + 2;
      local_1c = j;
      j = iVar1;
    }
    auxsort(L,local_20,local_1c);
  }
  return;
}

Assistant:

static void auxsort(lua_State *L, int l, int u)
{
  while (l < u) {  /* for tail recursion */
    int i, j;
    /* sort elements a[l], a[(l+u)/2] and a[u] */
    lua_rawgeti(L, 1, l);
    lua_rawgeti(L, 1, u);
    if (sort_comp(L, -1, -2))  /* a[u] < a[l]? */
      set2(L, l, u);  /* swap a[l] - a[u] */
    else
      lua_pop(L, 2);
    if (u-l == 1) break;  /* only 2 elements */
    i = (l+u)/2;
    lua_rawgeti(L, 1, i);
    lua_rawgeti(L, 1, l);
    if (sort_comp(L, -2, -1)) {  /* a[i]<a[l]? */
      set2(L, i, l);
    } else {
      lua_pop(L, 1);  /* remove a[l] */
      lua_rawgeti(L, 1, u);
      if (sort_comp(L, -1, -2))  /* a[u]<a[i]? */
	set2(L, i, u);
      else
	lua_pop(L, 2);
    }
    if (u-l == 2) break;  /* only 3 elements */
    lua_rawgeti(L, 1, i);  /* Pivot */
    lua_pushvalue(L, -1);
    lua_rawgeti(L, 1, u-1);
    set2(L, i, u-1);
    /* a[l] <= P == a[u-1] <= a[u], only need to sort from l+1 to u-2 */
    i = l; j = u-1;
    for (;;) {  /* invariant: a[l..i] <= P <= a[j..u] */
      /* repeat ++i until a[i] >= P */
      while (lua_rawgeti(L, 1, ++i), sort_comp(L, -1, -2)) {
	if (i>=u) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[i] */
      }
      /* repeat --j until a[j] <= P */
      while (lua_rawgeti(L, 1, --j), sort_comp(L, -3, -1)) {
	if (j<=l) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[j] */
      }
      if (j<i) {
	lua_pop(L, 3);  /* pop pivot, a[i], a[j] */
	break;
      }
      set2(L, i, j);
    }
    lua_rawgeti(L, 1, u-1);
    lua_rawgeti(L, 1, i);
    set2(L, u-1, i);  /* swap pivot (a[u-1]) with a[i] */
    /* a[l..i-1] <= a[i] == P <= a[i+1..u] */
    /* adjust so that smaller half is in [j..i] and larger one in [l..u] */
    if (i-l < u-i) {
      j=l; i=i-1; l=i+2;
    } else {
      j=i+1; i=u; u=j-2;
    }
    auxsort(L, j, i);  /* call recursively the smaller one */
  }  /* repeat the routine for the larger one */
}